

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O1

void __thiscall i2p_tests::damaged_private_key::test_method(damaged_private_key *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true> _Var2;
  pointer pcVar3;
  string message;
  string message_00;
  MatchFn match;
  MatchFn match_00;
  _Manager_type p_Var4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _func_unique_ptr<Sock,_std::default_delete<Sock>_>__Any_data_ptr_int_ptr_int_ptr_int_ptr *__tmp_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  long *plVar9;
  pointer ptVar10;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  long lVar13;
  long in_FS_OFFSET;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  bool proxy_error;
  Connection conn;
  DebugLogHelper debugloghelper28;
  DebugLogHelper debugloghelper27;
  Proxy sam_proxy;
  CService addr;
  CThreadInterrupt interrupt;
  Session session;
  path i2p_private_key_file;
  undefined4 uVar14;
  undefined4 uVar15;
  check_type cVar18;
  pointer ptVar16;
  pointer ptVar17;
  char *in_stack_fffffffffffffaf8;
  char *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  _Invoker_type in_stack_fffffffffffffb10;
  assertion_result local_4e8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  bool local_4a9;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  code *local_498;
  code *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  code *local_478;
  code *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  direct_or_indirect local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  Connection local_3f8;
  long *local_3a0 [2];
  long local_390 [2];
  DebugLogHelper local_380;
  long *local_330 [2];
  long local_320 [2];
  DebugLogHelper local_310;
  direct_or_indirect local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined2 local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  undefined8 local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined2 local_278;
  direct_or_indirect local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  undefined2 local_250;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_238 [5];
  undefined1 local_1e8 [8];
  bool local_1e0;
  undefined7 uStack_1df;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_3_a3f0114d_for___in6_u local_1c8;
  _Manager_type local_1b8;
  Connection *local_1b0;
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_188 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_148 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_108 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_c8 [48];
  long local_98 [2];
  path local_88;
  path local_60;
  long local_38;
  
  p_Var4 = CreateSock.super__Function_base._M_manager;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c8.__u6_addr32[0] = CreateSock.super__Function_base._M_functor._0_4_;
  local_1c8.__u6_addr32[1] = CreateSock.super__Function_base._M_functor._4_4_;
  local_1c8.__u6_addr32[2] = CreateSock.super__Function_base._M_functor._8_4_;
  local_1c8.__u6_addr32[3] = CreateSock.super__Function_base._M_functor._12_4_;
  CreateSock.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  CreateSock.super__Function_base._M_functor._8_8_ = 0;
  local_1b8 = CreateSock.super__Function_base._M_manager;
  CreateSock.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:135:18)>
       ::_M_manager;
  local_1b0 = (Connection *)CreateSock._M_invoker;
  CreateSock._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:135:18)>
       ::_M_invoke;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&local_1c8,(_Any_data *)&local_1c8,__destroy_functor);
  }
  ArgsManager::GetDataDir
            ((path *)&local_88,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_args,true);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x1c,"test_i2p_private_key_damaged");
  std::filesystem::__cxx11::path::path(&local_60,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[1],char_const(&)[39],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)local_1c8.__u6_addr8,
             (char (*) [1])0xf6cf21,(char (*) [39])"The private key is too short (0 < 387)");
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[5],char_const(&)[39],void>
            (local_188,(char (*) [5])"abcd",(char (*) [39])"The private key is too short (4 < 387)")
  ;
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,0x182,
             '\0');
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string,char_const(&)[41],void>
            (local_148,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
             (char (*) [41])"The private key is too short (386 < 387)");
  paVar1 = &local_310.m_message.field_2;
  local_310.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_310.m_message,0x181,'\0');
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_310.m_message,local_310.m_message._M_string_length,0,1,'\0');
  local_2c0.indirect_contents.indirect = (char *)&local_2b0;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if (paVar8 == paVar7) {
    local_2b0._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_2b0._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_2b0._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_2c0.indirect_contents.indirect = (char *)paVar8;
  }
  local_2c0._8_8_ = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_2c0.indirect_contents,local_2c0._8_8_,0,1,'\x01');
  local_3f8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                 ((long)&local_3f8.me.super_CNetAddr.m_addr._union + 8);
  _Var2.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if (_Var2.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)paVar8) {
    local_3f8.me.super_CNetAddr.m_addr._union._8_8_ = paVar8->_M_allocated_capacity;
    local_3f8.me.super_CNetAddr.m_addr._16_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_3f8.me.super_CNetAddr.m_addr._union._8_8_ = paVar8->_M_allocated_capacity;
    local_3f8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   _Var2.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                   super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                   super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  }
  local_3f8.me.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string,char_const(&)[101],void>
            (local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3f8,
             (char (*) [101])
             "Certificate length (1) designates that the private key should be 388 bytes, but it is only 387 bytes"
            );
  local_1e8 = (undefined1  [8])&local_1d8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,0x181,
             '\0');
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1e8,CONCAT71(uStack_1df,local_1e0),0,1,'\0');
  local_420.indirect_contents.indirect = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.indirect_contents.indirect == paVar8) {
    local_410._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_410._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_420.indirect_contents.indirect = (char *)&local_410;
  }
  else {
    local_410._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_420._8_8_ = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pvVar11 = (iterator)0x5;
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_420.indirect_contents,local_420._8_8_,0,1,'\x05');
  local_270.indirect_contents.indirect = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.indirect_contents.indirect == paVar8) {
    local_260._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_260._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_270.indirect_contents.indirect = (char *)&local_260;
  }
  else {
    local_260._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_270._8_8_ = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_270.indirect_contents,"abcd");
  paVar8 = &local_380.m_message.field_2;
  local_380.m_message._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.m_message._M_dataplus._M_p == paVar7) {
    local_380.m_message.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_380.m_message.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_380.m_message._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_380.m_message.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_380.m_message._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string,char_const(&)[101],void>
            (local_c8,&local_380.m_message,
             (char (*) [101])
             "Certificate length (5) designates that the private key should be 392 bytes, but it is only 391 bytes"
            );
  __l._M_len = 5;
  __l._M_array = (iterator)&local_1c8;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_438,__l,(allocator_type *)&local_4e8);
  lVar13 = -0x140;
  plVar9 = local_98;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    if (plVar9 + -4 != (long *)plVar9[-6]) {
      operator_delete((long *)plVar9[-6],plVar9[-4] + 1);
    }
    plVar9 = plVar9 + -8;
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.m_message._M_dataplus._M_p != paVar8) {
    operator_delete(local_380.m_message._M_dataplus._M_p,
                    local_380.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.indirect_contents.indirect != &local_260) {
    operator_delete(local_270.indirect_contents.indirect,local_260._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.indirect_contents.indirect != &local_410) {
    operator_delete(local_420.indirect_contents.indirect,local_410._M_allocated_capacity + 1);
  }
  if (local_1e8 != (undefined1  [8])&local_1d8) {
    operator_delete((void *)local_1e8,(ulong)(local_1d8._M_allocated_capacity + 1));
  }
  if (local_3f8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
      ((long)&local_3f8.me.super_CNetAddr.m_addr._union + 8)) {
    operator_delete((void *)local_3f8.sock._M_t.
                            super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                            super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                    local_3f8.me.super_CNetAddr.m_addr._union._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.indirect_contents.indirect != &local_2b0) {
    operator_delete(local_2c0.indirect_contents.indirect,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_310.m_message._M_dataplus._M_p,
                    local_310.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,aaStack_238[0]._M_allocated_capacity + 1);
  }
  if (local_438.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_438.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar10 = local_438.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ptVar17 = local_438.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      local_448 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
      ;
      local_440 = "";
      local_458 = &boost::unit_test::basic_cstring<char_const>::null;
      local_450 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x9c;
      file.m_begin = (iterator)&local_448;
      msg.m_end = in_R9;
      msg.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_458,msg)
      ;
      bVar5 = WriteBinaryFile((path *)&local_60,
                              &(ptVar10->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl);
      local_248[0] = bVar5;
      local_248._8_8_ = 0;
      aaStack_238[0]._M_allocated_capacity = 0;
      local_3f8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0xe97a12;
      local_3f8.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
      local_1c8.__u6_addr32[2] = local_1c8.__u6_addr32[2] & 0xffffff00;
      local_1c8.__u6_addr32[0] = 0x13abc70;
      local_1c8.__u6_addr32[1] = 0;
      local_1b8 = (_Manager_type)boost::unit_test::lazy_ostream::inst;
      local_1b0 = &local_3f8;
      local_468 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
      ;
      local_460 = "";
      uVar14 = 0;
      uVar15 = 0;
      pvVar11 = (iterator)0x2;
      pvVar12 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_248,(lazy_ostream *)&local_1c8,2,0,WARN,_cVar18,
                 (size_t)&local_468,0x9c);
      boost::detail::shared_count::~shared_count((shared_count *)(local_248 + 0x10));
      CThreadInterrupt::CThreadInterrupt((CThreadInterrupt *)local_248);
      local_1c8.__u6_addr32[2] = 0;
      local_1c8.__u6_addr32[0] = 0;
      local_1c8.__u6_addr32[1] = 0;
      local_1c8.__u6_addr32[3] = 0x1000000;
      CService::CService((CService *)&local_270.indirect_contents,(in6_addr *)&local_1c8,0x1de8);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2c0.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_270.indirect_contents);
      local_2b0._8_8_ = local_260._8_8_;
      local_2a0 = local_250;
      local_298 = &local_288;
      local_290 = 0;
      local_288._M_local_buf[0] = '\0';
      local_278 = 0;
      i2p::sam::Session::Session
                ((Session *)&local_1c8,(path *)&local_60,(Proxy *)&local_2c0.indirect_contents,
                 (CThreadInterrupt *)local_248);
      local_330[0] = local_320;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_330,"Creating persistent SAM session","");
      local_488 = 0;
      uStack_480 = 0;
      local_470 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                  ::_M_invoke;
      local_478 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                  ::_M_manager;
      message._M_dataplus._M_p._4_4_ = uVar15;
      message._M_dataplus._M_p._0_4_ = uVar14;
      message._M_string_length = (size_type)_cVar18;
      message.field_2._M_allocated_capacity = (size_type)ptVar10;
      message.field_2._8_8_ = ptVar17;
      match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb00;
      match.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffaf8;
      match.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb08;
      match._M_invoker = in_stack_fffffffffffffb10;
      DebugLogHelper::DebugLogHelper(&local_310,message,match);
      if (local_478 != (code *)0x0) {
        (*local_478)(&local_488,&local_488,3);
      }
      if (local_330[0] != local_320) {
        operator_delete(local_330[0],local_320[0] + 1);
      }
      local_3a0[0] = local_390;
      pcVar3 = (ptVar10->
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p;
      ptVar16 = ptVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3a0,pcVar3,
                 pcVar3 + (ptVar10->
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_string_length);
      local_4a8 = 0;
      uStack_4a0 = 0;
      local_490 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                  ::_M_invoke;
      local_498 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                  ::_M_manager;
      message_00._M_dataplus._M_p._4_4_ = uVar15;
      message_00._M_dataplus._M_p._0_4_ = uVar14;
      message_00._M_string_length = (size_type)_cVar18;
      message_00.field_2._M_allocated_capacity = (size_type)ptVar16;
      message_00.field_2._8_8_ = ptVar17;
      match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb00;
      match_00.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffaf8;
      match_00.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb08;
      match_00._M_invoker = in_stack_fffffffffffffb10;
      DebugLogHelper::DebugLogHelper(&local_380,message_00,match_00);
      if (local_498 != (code *)0x0) {
        (*local_498)(&local_4a8,&local_4a8,3);
      }
      if (local_3a0[0] != local_390) {
        operator_delete(local_3a0[0],local_390[0] + 1);
      }
      local_3f8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
      CService::CService(&local_3f8.me);
      CService::CService(&local_3f8.peer);
      local_4c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
      ;
      local_4b8 = "";
      local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xa9;
      file_00.m_begin = (iterator)&local_4c0;
      msg_00.m_end = pvVar12;
      msg_00.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4d0,
                 msg_00);
      CService::CService((CService *)&local_420.indirect_contents);
      bVar5 = i2p::sam::Session::Connect
                        ((Session *)&local_1c8,(CService *)&local_420.indirect_contents,&local_3f8,
                         &local_4a9);
      local_4e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)!bVar5;
      local_4e8.m_message.px = (element_type *)0x0;
      local_4e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      in_stack_fffffffffffffb08 = "!session.Connect(CService{}, conn, proxy_error)";
      in_stack_fffffffffffffb10 = (_Invoker_type)0xe9781b;
      local_1e0 = false;
      local_1e8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      local_1d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1d8._8_8_ = &stack0xfffffffffffffb08;
      in_stack_fffffffffffffaf8 =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
      ;
      in_stack_fffffffffffffb00 = "";
      pvVar11 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_4e8,(lazy_ostream *)local_1e8,1,0,WARN,_cVar18,
                 (size_t)&stack0xfffffffffffffaf8,0xa9);
      boost::detail::shared_count::~shared_count(&local_4e8.m_message.pn);
      if (0x10 < (uint)local_410._M_allocated_capacity._0_4_) {
        free(local_420.indirect_contents.indirect);
        local_420.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_3f8.peer.super_CNetAddr.m_addr._size) {
        free(local_3f8.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        local_3f8.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_3f8.me.super_CNetAddr.m_addr._size) {
        free(local_3f8.me.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        local_3f8.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (local_3f8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
        (**(code **)(*(long *)local_3f8.sock._M_t.
                              super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                              super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                              super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
      }
      DebugLogHelper::~DebugLogHelper(&local_380);
      DebugLogHelper::~DebugLogHelper(&local_310);
      i2p::sam::Session::~Session((Session *)&local_1c8);
      if (local_298 != &local_288) {
        operator_delete(local_298,
                        CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) +
                        1);
      }
      if (0x10 < (uint)local_2b0._M_allocated_capacity._0_4_) {
        free(local_2c0.indirect_contents.indirect);
        local_2c0.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < (uint)local_260._M_allocated_capacity._0_4_) {
        free(local_270.indirect_contents.indirect);
        local_270.indirect_contents.indirect = (char *)0x0;
      }
      std::condition_variable::~condition_variable((condition_variable *)local_248);
      ptVar10 = ptVar10 + 1;
    } while (ptVar10 != ptVar17);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_438);
  std::filesystem::__cxx11::path::~path(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(damaged_private_key)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>("HELLO REPLY RESULT=OK VERSION=3.1\n"
                                                    "SESSION STATUS RESULT=OK DESTINATION=\n");
    };

    const auto i2p_private_key_file = m_args.GetDataDirNet() / "test_i2p_private_key_damaged";

    for (const auto& [file_contents, expected_error] : std::vector<std::tuple<std::string, std::string>>{
             {"", "The private key is too short (0 < 387)"},

             {"abcd", "The private key is too short (4 < 387)"},

             {std::string(386, '\0'), "The private key is too short (386 < 387)"},

             {std::string(385, '\0') + '\0' + '\1',
              "Certificate length (1) designates that the private key should be 388 bytes, but it is only "
              "387 bytes"},

             {std::string(385, '\0') + '\0' + '\5' + "abcd",
              "Certificate length (5) designates that the private key should be 392 bytes, but it is only "
              "391 bytes"}}) {
        BOOST_REQUIRE(WriteBinaryFile(i2p_private_key_file, file_contents));

        CThreadInterrupt interrupt;
        const CService addr{in6_addr(IN6ADDR_LOOPBACK_INIT), /*port=*/7656};
        const Proxy sam_proxy{addr, false};
        i2p::sam::Session session(i2p_private_key_file, sam_proxy, &interrupt);

        {
            ASSERT_DEBUG_LOG("Creating persistent SAM session");
            ASSERT_DEBUG_LOG(expected_error);

            i2p::Connection conn;
            bool proxy_error;
            BOOST_CHECK(!session.Connect(CService{}, conn, proxy_error));
        }
    }
}